

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

void __thiscall QBuffer::setBuffer(QBuffer *this,QByteArray *byteArray)

{
  bool bVar1;
  QBufferPrivate *this_00;
  QByteArray *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QBufferPrivate *d;
  QMessageLogger *this_01;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QBuffer *)0x273b6e);
  bVar1 = QIODevice::isOpen((QIODevice *)this_00);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (this_01,(char *)in_RSI,(int)((ulong)this_00 >> 0x20),(char *)in_RDI);
    QMessageLogger::warning(&local_28,"QBuffer::setBuffer: Buffer is open");
  }
  else {
    if (in_RSI == (QByteArray *)0x0) {
      this_00->buf = &this_00->defaultBuf;
    }
    else {
      this_00->buf = in_RSI;
    }
    QByteArray::clear((QByteArray *)0x273bee);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBuffer::setBuffer(QByteArray *byteArray)
{
    Q_D(QBuffer);
    if (isOpen()) {
        qWarning("QBuffer::setBuffer: Buffer is open");
        return;
    }
    if (byteArray) {
        d->buf = byteArray;
    } else {
        d->buf = &d->defaultBuf;
    }
    d->defaultBuf.clear();
}